

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-filepath.cc
# Opt level: O1

FilePath *
testing::internal::FilePath::ConcatPaths
          (FilePath *__return_storage_ptr__,FilePath *directory,FilePath *relative_path)

{
  pointer pcVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  __string_type __str;
  FilePath dir;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  size_type *local_60;
  size_type local_58;
  size_type local_50;
  undefined4 uStack_48;
  undefined4 uStack_44;
  FilePath local_40;
  
  if ((directory->pathname_)._M_string_length == 0) {
    (__return_storage_ptr__->pathname_)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->pathname_).field_2;
    pcVar1 = (relative_path->pathname_)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar1,
               pcVar1 + (relative_path->pathname_)._M_string_length);
  }
  else {
    RemoveTrailingPathSeparator(&local_40,directory);
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_80,local_40.pathname_._M_dataplus._M_p,
               local_40.pathname_._M_dataplus._M_p + local_40.pathname_._M_string_length);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace_aux
              (&local_80,local_80._M_string_length,0,1,'/');
    pbVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             _M_append(&local_80,(relative_path->pathname_)._M_dataplus._M_p,
                       (relative_path->pathname_)._M_string_length);
    local_60 = (size_type *)(pbVar2->_M_dataplus)._M_p;
    paVar3 = &pbVar2->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60 == paVar3) {
      local_50 = paVar3->_M_allocated_capacity;
      uStack_48 = *(undefined4 *)((long)&pbVar2->field_2 + 8);
      uStack_44 = *(undefined4 *)((long)&pbVar2->field_2 + 0xc);
      local_60 = &local_50;
    }
    else {
      local_50 = paVar3->_M_allocated_capacity;
    }
    local_58 = pbVar2->_M_string_length;
    (pbVar2->_M_dataplus)._M_p = (pointer)paVar3;
    pbVar2->_M_string_length = 0;
    (pbVar2->field_2)._M_local_buf[0] = '\0';
    (__return_storage_ptr__->pathname_)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->pathname_).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,local_60,(pointer)(local_58 + (long)local_60));
    Normalize(__return_storage_ptr__);
    if (local_60 != &local_50) {
      operator_delete(local_60,local_50 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40.pathname_._M_dataplus._M_p != &local_40.pathname_.field_2) {
      operator_delete(local_40.pathname_._M_dataplus._M_p,
                      local_40.pathname_.field_2._M_allocated_capacity + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

FilePath FilePath::ConcatPaths(const FilePath& directory,
                               const FilePath& relative_path) {
  if (directory.IsEmpty())
    return relative_path;
  const FilePath dir(directory.RemoveTrailingPathSeparator());
  return FilePath(dir.string() + kPathSeparator + relative_path.string());
}